

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

int Super_WriteCompare(Super_Gate_t_conflict **ppG1,Super_Gate_t_conflict **ppG2)

{
  Super_Gate_t_conflict *pSVar1;
  Super_Gate_t_conflict *pSVar2;
  uint *pTruth2;
  uint *pTruth1;
  Super_Gate_t_conflict **ppG2_local;
  Super_Gate_t_conflict **ppG1_local;
  
  pSVar1 = *ppG1;
  pSVar2 = *ppG2;
  if (pSVar1->uTruth[1] < pSVar2->uTruth[1]) {
    ppG1_local._4_4_ = -1;
  }
  else if (pSVar2->uTruth[1] < pSVar1->uTruth[1]) {
    ppG1_local._4_4_ = 1;
  }
  else if (pSVar1->uTruth[0] < pSVar2->uTruth[0]) {
    ppG1_local._4_4_ = -1;
  }
  else if (pSVar2->uTruth[0] < pSVar1->uTruth[0]) {
    ppG1_local._4_4_ = 1;
  }
  else {
    ppG1_local._4_4_ = 0;
  }
  return ppG1_local._4_4_;
}

Assistant:

int Super_WriteCompare( Super_Gate_t ** ppG1, Super_Gate_t ** ppG2 )
{
    unsigned * pTruth1 = (*ppG1)->uTruth;
    unsigned * pTruth2 = (*ppG2)->uTruth;
    if ( pTruth1[1] < pTruth2[1] )
        return -1;
    if ( pTruth1[1] > pTruth2[1] )
        return 1;
    if ( pTruth1[0] < pTruth2[0] )
        return -1;
    if ( pTruth1[0] > pTruth2[0] )
        return 1;
    return 0;
}